

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O2

int BIO_read(BIO *b,void *data,int len)

{
  _func_596 *p_Var1;
  int line;
  uint uVar2;
  int reason;
  
  if (((b == (BIO *)0x0) || (b->method == (BIO_METHOD *)0x0)) ||
     (p_Var1 = b->method->bread, p_Var1 == (_func_596 *)0x0)) {
    reason = 0x73;
    line = 0x53;
  }
  else {
    if (*(int *)&b->cb_arg != 0) {
      if (len < 1) {
        return 0;
      }
      uVar2 = (*p_Var1)(b,(char *)data,len);
      if ((int)uVar2 < 1) {
        return uVar2;
      }
      b->next_bio = (bio_st *)((long)&b->next_bio->method + (ulong)uVar2);
      return uVar2;
    }
    reason = 0x72;
    line = 0x57;
  }
  ERR_put_error(0x11,0,reason,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                ,line);
  return -2;
}

Assistant:

int BIO_read(BIO *bio, void *buf, int len) {
  if (bio == NULL || bio->method == NULL || bio->method->bread == NULL) {
    OPENSSL_PUT_ERROR(BIO, BIO_R_UNSUPPORTED_METHOD);
    return -2;
  }
  if (!bio->init) {
    OPENSSL_PUT_ERROR(BIO, BIO_R_UNINITIALIZED);
    return -2;
  }
  if (len <= 0) {
    return 0;
  }
  int ret = bio->method->bread(bio, reinterpret_cast<char *>(buf), len);
  if (ret > 0) {
    bio->num_read += ret;
  }
  return ret;
}